

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEdge.c
# Opt level: O0

int Edg_ManEvalEdgeDelayR(Gia_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int local_1c;
  int DelayMax;
  int Delay;
  int iLut;
  Gia_Man_t *p_local;
  
  local_1c = 0;
  if ((p->vEdge1 != (Vec_Int_t *)0x0) && (p->vEdge2 != (Vec_Int_t *)0x0)) {
    if (p->vEdgeDelayR == (Vec_Int_t *)0x0) {
      iVar1 = Gia_ManObjNum(p);
      pVVar2 = Vec_IntStart(iVar1);
      p->vEdgeDelayR = pVVar2;
    }
    else {
      pVVar2 = p->vEdgeDelayR;
      iVar1 = Gia_ManObjNum(p);
      Vec_IntFill(pVVar2,iVar1,0);
    }
    DelayMax = Gia_ManObjNum(p);
    while (DelayMax = DelayMax + -1, 0 < DelayMax) {
      iVar1 = Gia_ObjIsLut2(p,DelayMax);
      if (iVar1 != 0) {
        iVar1 = Edg_ObjEvalEdgeDelayR(p,DelayMax,p->vEdgeDelayR);
        Vec_IntWriteEntry(p->vEdgeDelayR,DelayMax,iVar1);
        local_1c = Abc_MaxInt(local_1c,iVar1);
      }
    }
    return local_1c;
  }
  __assert_fail("p->vEdge1 && p->vEdge2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEdge.c"
                ,0x2e0,"int Edg_ManEvalEdgeDelayR(Gia_Man_t *)");
}

Assistant:

int Edg_ManEvalEdgeDelayR( Gia_Man_t * p )
{
//    int k, DelayNoEdge = 1;
    int iLut, Delay, DelayMax = 0;
    assert( p->vEdge1 && p->vEdge2 );
    if ( p->vEdgeDelayR == NULL )
        p->vEdgeDelayR = Vec_IntStart( Gia_ManObjNum(p) );
    else
        Vec_IntFill( p->vEdgeDelayR, Gia_ManObjNum(p), 0 );
//    Gia_ManForEachCoDriverId( p, iLut, k )
//        Vec_IntWriteEntry( p->vEdgeDelayR, iLut, DelayNoEdge );
    Gia_ManForEachLut2Reverse( p, iLut )
    {
        Delay = Edg_ObjEvalEdgeDelayR(p, iLut, p->vEdgeDelayR);
        Vec_IntWriteEntry( p->vEdgeDelayR, iLut, Delay );
        DelayMax = Abc_MaxInt( DelayMax, Delay );
    }
    return DelayMax;
}